

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O3

size_t __thiscall amrex::CArena::sizeOf(CArena *this,void *p)

{
  const_iterator cVar1;
  key_type local_18;
  
  if (p != (void *)0x0) {
    local_18.m_owner = (void *)0x0;
    local_18.m_size = 0;
    local_18.m_block = p;
    cVar1 = std::
            _Hashtable<amrex::CArena::Node,_amrex::CArena::Node,_std::allocator<amrex::CArena::Node>,_std::__detail::_Identity,_std::equal_to<amrex::CArena::Node>,_amrex::CArena::Node::hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->m_busylist)._M_h,&local_18);
    if (cVar1.super__Node_iterator_base<amrex::CArena::Node,_false>._M_cur != (__node_type *)0x0) {
      return *(size_t *)
              ((long)cVar1.super__Node_iterator_base<amrex::CArena::Node,_false>._M_cur + 0x18);
    }
  }
  return 0;
}

Assistant:

std::size_t
CArena::sizeOf (void* p) const noexcept
{
    if (p == nullptr) {
        return 0;
    } else {
        auto it = m_busylist.find(Node(p,0,0));
        if (it == m_busylist.end()) {
            return 0;
        } else {
            return it->size();
        }
    }
}